

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O1

void __thiscall PrintAST::visit(PrintAST *this,ProgramNode *node)

{
  VarDeclNode *pVVar1;
  TypeDeclNode *pTVar2;
  FunctionListNode *pFVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n------------------------------",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---- ABSTRACT SYNTAX TREE ----",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------------\n",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printAST(this,"PROGRAM");
  this->level = this->level + 1;
  pVVar1 = node->varlist;
  if (pVVar1 != (VarDeclNode *)0x0) {
    (*(pVVar1->super_ASTNode)._vptr_ASTNode[3])(pVVar1,this);
  }
  pTVar2 = node->typelist;
  if (pTVar2 != (TypeDeclNode *)0x0) {
    (*(pTVar2->super_ASTNode)._vptr_ASTNode[3])(pTVar2,this);
  }
  pFVar3 = node->functions;
  if (pFVar3 != (FunctionListNode *)0x0) {
    (*(pFVar3->super_ASTNode)._vptr_ASTNode[3])(pFVar3,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(ProgramNode *node) {
    std::cout << "\n------------------------------" << std::endl;
    std::cout << "---- ABSTRACT SYNTAX TREE ----" << std::endl;
    std::cout << "------------------------------\n" << std::endl;
    this->printAST("PROGRAM");
    up_level();
    if (node->getVarList() != nullptr) {
        node->getVarList()->accept(this);
    }
    if (node->getTypeList() != nullptr) {
        node->getTypeList()->accept(this);
    }
    if (node->getFunctions() != nullptr) {
        node->getFunctions()->accept(this);
    }
    down_level();
}